

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

string * __thiscall
ot::commissioner::Interpreter::BaAvailabilityToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,uint32_t aAvailability)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 1) {
    pcVar2 = "high";
    pcVar1 = "";
  }
  else if ((int)this == 0) {
    pcVar2 = "low";
    pcVar1 = "";
  }
  else {
    pcVar2 = "reserved";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::BaAvailabilityToString(uint32_t aAvailability)
{
    switch (aAvailability)
    {
    case 0:
        return "low";
    case 1:
        return "high";
    default:
        return "reserved";
    }
}